

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::calc_dpdt(PeleLM *this,Real time,Real dt,MultiFab *dpdt)

{
  FabArray<amrex::FArrayBox> *this_00;
  Real RVar1;
  TimeCenter TVar2;
  TimeLevel TVar3;
  int iVar4;
  long lVar5;
  Geometry *this_01;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  MFIter mfi;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  dVar11 = p_amb_old;
  if (closed_chamber == 1) {
    lVar9 = *(long *)((long)(((((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                     + 0x170);
    TVar2 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar9 + 8));
    if (TVar2 == Point) {
      dVar11 = *(double *)(lVar9 + 0xc0);
    }
    else {
      dVar11 = (*(double *)(lVar9 + 0xb8) + *(double *)(lVar9 + 0xc0)) * 0.5;
    }
    TVar2 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar9 + 8));
    if (TVar2 == Point) {
      dVar12 = *(double *)(lVar9 + 0xb0);
    }
    else {
      dVar12 = (*(double *)(lVar9 + 0xa8) + *(double *)(lVar9 + 0xb0)) * 0.5;
    }
    dVar11 = ((dVar12 - time) / (dVar12 - dVar11)) * p_amb_old +
             ((time - dVar11) / (dVar12 - dVar11)) * p_amb_new;
  }
  if ((0.0 < dt) && (0.0 < dpdt_factor)) {
    TVar3 = amrex::AmrLevel::which_time((AmrLevel *)this,0,time);
    this_00 = *(FabArray<amrex::FArrayBox> **)
               (&((this->super_NavierStokesBase).super_AmrLevel.state.
                  super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                  super__Vector_impl_data._M_start)->new_data + (TVar3 == AmrOldTime));
    amrex::MFIter::MFIter(&local_90,(FabArrayBase *)dpdt,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        amrex::MFIter::tilebox(&local_12c,&local_90);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_d0,&dpdt->super_FabArray<amrex::FArrayBox>,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,this_00,&local_90,RhoRT);
        RVar1 = dpdt_factor;
        if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
          lVar9 = (long)local_12c.smallend.vect[1];
          iVar4 = local_12c.smallend.vect[2];
          do {
            if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
              lVar8 = (long)local_d0.p +
                      ((long)iVar4 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                      (lVar9 - local_d0.begin.y) * local_d0.jstride * 8 +
                      (long)local_12c.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8;
              lVar7 = (long)local_110.p +
                      ((long)iVar4 - (long)local_110.begin.z) * local_110.kstride * 8 +
                      (lVar9 - local_110.begin.y) * local_110.jstride * 8 +
                      (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8;
              lVar6 = lVar9;
              do {
                if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                  lVar5 = 0;
                  do {
                    dVar12 = *(double *)(lVar7 + lVar5 * 8);
                    *(double *)(lVar8 + lVar5 * 8) = ((dVar12 - dVar11) / (dVar12 * dt)) * RVar1;
                    lVar5 = lVar5 + 1;
                  } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar5
                          );
                }
                lVar6 = lVar6 + 1;
                lVar8 = lVar8 + local_d0.jstride * 8;
                lVar7 = lVar7 + local_110.jstride * 8;
              } while (local_12c.bigend.vect[1] + 1 != (int)lVar6);
            }
            bVar10 = iVar4 != local_12c.bigend.vect[2];
            iVar4 = iVar4 + 1;
          } while (bVar10);
        }
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    amrex::MFIter::~MFIter(&local_90);
    if (0 < (dpdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
      this_01 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
      local_90._0_12_ = amrex::Geometry::periodicity(this_01);
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                (&dpdt->super_FabArray<amrex::FArrayBox>,0,1,(Periodicity *)&local_90,false);
      amrex::Extrapolater::FirstOrderExtrap
                (dpdt,this_01,0,1,
                 (dpdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
    }
    return;
  }
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&dpdt->super_FabArray<amrex::FArrayBox>,0.0,0,
             (dpdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(dpdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  return;
}

Assistant:

void
PeleLM::calc_dpdt (Real      time,
                   Real      dt,
                   MultiFab& dpdt)
{
    BL_PROFILE("PLM::calc_dpdt()");

    // for open chambers, ambient pressure is constant in time
    Real p_amb = p_amb_old;

    if (closed_chamber == 1)
    {
        // for closed chambers, use piecewise-linear interpolation
        // we need level 0 prev and tnp1 for closed chamber algorithm
        AmrLevel& amr_lev = parent->getLevel(0);
        StateData& state_data = amr_lev.get_state_data(0);
        const Real lev_0_prevtime = state_data.prevTime();
        const Real lev_0_curtime = state_data.curTime();

        // linearly interpolate from level 0 ambient pressure
        p_amb = (lev_0_curtime - time )/(lev_0_curtime-lev_0_prevtime) * p_amb_old +
                (time - lev_0_prevtime)/(lev_0_curtime-lev_0_prevtime) * p_amb_new;
    }

    if (dt <= 0.0 || dpdt_factor <= 0)
    {
        dpdt.setVal(0);
        return;
    }

    const TimeLevel whichTime = which_time(State_Type, time);
    AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
    const MultiFab& S = (whichTime == AmrOldTime) ? get_old_data(State_Type) : get_new_data(State_Type);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dpdt,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& dPdt  = dpdt.array(mfi);
        auto const& P     = S.const_array(mfi,RhoRT);

        amrex::ParallelFor(bx, [dPdt, P, p_amb, dt, dpdt_fac = dpdt_factor]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           dPdt(i,j,k) = (P(i,j,k) - p_amb) / ( dt * P(i,j,k) ) * dpdt_fac;
        });
    }

    if (dpdt.nGrow() > 0) {
        dpdt.FillBoundary(0, 1, geom.periodicity());
        Extrapolater::FirstOrderExtrap(dpdt, geom, 0, 1, dpdt.nGrow());
    }
}